

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgHierarchyManipulator.cpp
# Opt level: O1

Data2D<int> *
TasGrid::HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>
          (Data2D<int> *__return_storage_ptr__,MultiIndexSet *mset)

{
  size_type __n;
  pointer piVar1;
  int iVar2;
  size_t sVar3;
  size_type sVar4;
  pointer __src;
  unsigned_long __n2;
  size_t sVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_69;
  vector<int,_std::allocator<int>_> *local_68;
  Data2D<int> *local_60;
  vector<int,_std::allocator<int>_> local_58;
  size_t local_40;
  size_t local_38;
  
  __n = mset->num_dimensions;
  sVar3 = (size_t)mset->cache_num_indexes;
  __return_storage_ptr__->stride = (long)(int)__n;
  __return_storage_ptr__->num_strips = sVar3;
  local_68 = &__return_storage_ptr__->vec;
  local_60 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            (local_68,(long)(int)__n * sVar3,(allocator_type *)&local_58);
  if (0 < (long)sVar3) {
    local_40 = __n * 4;
    sVar5 = 0;
    local_38 = sVar3;
    do {
      __src = (mset->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + mset->num_dimensions * sVar5;
      ::std::vector<int,_std::allocator<int>_>::vector(&local_58,__n,&local_69);
      if (__n != 0) {
        memmove(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,__src,local_40);
        lVar6 = local_60->stride * sVar5;
        piVar1 = (local_60->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar4 = 0;
        do {
          iVar2 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar4];
          if (iVar2 == 0) {
            piVar1[lVar6 + sVar4] = -1;
          }
          else {
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar4] = (iVar2 - (iVar2 + -1 >> 0x1f)) + -1 >> 1;
            iVar2 = MultiIndexSet::getSlot
                              (mset,local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            while ((piVar1[lVar6 + sVar4] = iVar2, iVar2 == -1 &&
                   (iVar2 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sVar4], iVar2 != 0))) {
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[sVar4] = (iVar2 - (iVar2 + -1 >> 0x1f)) + -1 >> 1;
              iVar2 = MultiIndexSet::getSlot
                                (mset,local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start);
            }
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar4] = __src[sVar4];
          }
          sVar4 = sVar4 + 1;
        } while (sVar4 != __n);
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != local_38);
  }
  return local_60;
}

Assistant:

Data2D<int> computeDAGup(MultiIndexSet const &mset){
    size_t num_dimensions = mset.getNumDimensions();
    int num_points = mset.getNumIndexes();
    if (RuleLocal::getMaxNumParents<effrule>() > 1){ // allow for multiple parents and level 0 may have more than one node
        int max_parents = RuleLocal::getMaxNumParents<effrule>() * (int) num_dimensions;
        Data2D<int> parents(max_parents, num_points, -1);
        int level0_offset = RuleLocal::getNumPoints<effrule>(0);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] >= level0_offset){
                    int current = p[j];
                    dad[j] = RuleLocal::getParent<effrule>(current);
                    pp[2*j] = mset.getSlot(dad);
                    while ((dad[j] >= level0_offset) && (pp[2*j] == -1)){
                        current = dad[j];
                        dad[j] = RuleLocal::getParent<effrule>(current);
                        pp[2*j] = mset.getSlot(dad);
                    }
                    dad[j] = RuleLocal::getStepParent<effrule>(current);
                    if (dad[j] != -1){
                        pp[2*j + 1] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }else{ // this assumes that level zero has only one node
        Data2D<int> parents((int) num_dimensions, num_points);
        #pragma omp parallel for schedule(static)
        for(int i=0; i<num_points; i++){
            const int *p = mset.getIndex(i);
            std::vector<int> dad(num_dimensions);
            std::copy_n(p, num_dimensions, dad.data());
            int *pp = parents.getStrip(i);
            for(size_t j=0; j<num_dimensions; j++){
                if (dad[j] == 0){
                    pp[j] = -1;
                }else{
                    dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                    pp[j] = mset.getSlot(dad.data());
                    while((dad[j] != 0) && (pp[j] == -1)){
                        dad[j] = RuleLocal::getParent<effrule>(dad[j]);
                        pp[j] = mset.getSlot(dad);
                    }
                    dad[j] = p[j];
                }
            }
        }
        return parents;
    }
}